

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::AddCurrentError(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *this,SchemaErrorCode code,PointerType *location)

{
  GValue *this_00;
  StringRefType *pSVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *keyword;
  GenericStringRef<char> local_50;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_40;
  GenericStringRef<char> local_30;
  PointerType *local_20;
  PointerType *location_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *pGStack_10;
  SchemaErrorCode code_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  this_00 = &this->currentError_;
  local_20 = location;
  location_local._4_4_ = code;
  pGStack_10 = this;
  pSVar1 = GetErrorCodeString();
  GenericStringRef<char>::GenericStringRef(&local_30,pSVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  AddMember<rapidjson::SchemaErrorCode>(this_00,&local_30,location_local._4_4_,this->allocator_);
  AddErrorInstanceLocation(this,this_00,local_20);
  pSVar1 = GetSchemaErrorKeyword(location_local._4_4_);
  GenericStringRef<char>::GenericStringRef(&local_50,pSVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_40,&local_50);
  keyword = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_40);
  AddError(this,keyword,this_00);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_40);
  return;
}

Assistant:

void AddCurrentError(const SchemaErrorCode code, const PointerType& location) {
      RAPIDJSON_SCHEMA_PRINT(InvalidKeyword, GetSchemaErrorKeyword(code));
      currentError_.AddMember(GetErrorCodeString(), code, *allocator_);
      AddErrorInstanceLocation(currentError_, location);
      AddError(GValue(GetSchemaErrorKeyword(code)).Move(), currentError_);
    }